

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::SectionTracking::TestCaseTracker::enterSection(TestCaseTracker *this,string *name)

{
  _Rb_tree_color _Var1;
  TrackedSection *this_00;
  iterator iVar2;
  bool bVar3;
  
  if (this->m_completedASectionThisRun != false) {
    return false;
  }
  this_00 = this->m_currentSection;
  if (this_00->m_runState == Executing) {
    TrackedSection::addChild(this_00,name);
    bVar3 = false;
  }
  else {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
            ::find(&(this_00->m_children)._M_t,name);
    _Var1 = iVar2._M_node[3]._M_color;
    bVar3 = _Var1 != 3;
    if (bVar3) {
      this->m_currentSection = (TrackedSection *)(iVar2._M_node + 2);
      bVar3 = true;
      if (_Var1 == _S_red) {
        iVar2._M_node[3]._M_color = _S_black;
      }
    }
  }
  return bVar3;
}

Assistant:

bool enterSection( std::string const& name ) {
            if( m_completedASectionThisRun )
                return false;
            if( m_currentSection->runState() == TrackedSection::Executing ) {
                m_currentSection->addChild( name );
                return false;
            }
            else {
                TrackedSection* child = m_currentSection->getChild( name );
                if( child->runState() != TrackedSection::Completed ) {
                    m_currentSection = child;
                    m_currentSection->enter();
                    return true;
                }
                return false;
            }
        }